

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

bool __thiscall anon_unknown.dwarf_529805::QPDFWordTokenFinder::check(QPDFWordTokenFinder *this)

{
  InputSource *input;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  qpdf_offset_t qVar4;
  undefined4 extraout_var_00;
  string *context;
  allocator<char> local_d9;
  char next;
  Tokenizer tokenizer;
  
  ::qpdf::Tokenizer::Tokenizer(&tokenizer);
  input = this->is;
  std::__cxx11::string::string<std::allocator<char>>((string *)&next,"finder",&local_d9);
  ::qpdf::Tokenizer::nextToken(&tokenizer,input,context,(this->str)._M_string_length + 2);
  std::__cxx11::string::~string((string *)&next);
  iVar2 = (*this->is->_vptr_InputSource[4])();
  if (tokenizer.type == tt_word) {
    bVar1 = std::operator!=(&tokenizer.raw_val,&this->str);
    if (!bVar1) {
      qVar4 = InputSource::getLastOffset(this->is);
      iVar3 = (*this->is->_vptr_InputSource[7])(this->is,&next,1);
      if (CONCAT44(extraout_var_00,iVar3) == 0) {
        bVar1 = true;
      }
      else {
        bVar1 = is_delimiter(next);
      }
      (*this->is->_vptr_InputSource[5])(this->is,CONCAT44(extraout_var,iVar2),0);
      bVar1 = (bool)(bVar1 & qVar4 != 0);
      goto LAB_001b3cc9;
    }
  }
  bVar1 = false;
LAB_001b3cc9:
  ::qpdf::Tokenizer::~Tokenizer(&tokenizer);
  return bVar1;
}

Assistant:

bool
QPDFWordTokenFinder::check()
{
    // Find a word token matching the given string, preceded by a delimiter, and followed by a
    // delimiter or EOF.
    Tokenizer tokenizer;
    tokenizer.nextToken(is, "finder", str.size() + 2);
    qpdf_offset_t pos = is.tell();
    if (tokenizer.getType() != tt::tt_word || tokenizer.getValue() != str) {
        QTC::TC("qpdf", "QPDFTokenizer finder found wrong word");
        return false;
    }
    qpdf_offset_t token_start = is.getLastOffset();
    char next;
    bool next_okay = false;
    if (is.read(&next, 1) == 0) {
        QTC::TC("qpdf", "QPDFTokenizer inline image at EOF");
        next_okay = true;
    } else {
        next_okay = is_delimiter(next);
    }
    is.seek(pos, SEEK_SET);
    if (!next_okay) {
        return false;
    }
    if (token_start == 0) {
        // Can't actually happen...we never start the search at the beginning of the input.
        return false;
    }
    return true;
}